

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O0

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateColsPS::DuplicateColsPS(DuplicateColsPS *this,DuplicateColsPS *old)

{
  DataArray<int> *in_RSI;
  cpp_dec_float<200U,_int,_void> *in_RDI;
  cpp_dec_float<200U,_int,_void> *in_stack_ffffffffffffff90;
  DataArray<int> *in_stack_ffffffffffffff98;
  
  PostStep::PostStep((PostStep *)in_stack_ffffffffffffff90,(PostStep *)in_RDI);
  *(undefined ***)(in_RDI->data)._M_elems = &PTR__DuplicateColsPS_008a06c0;
  (in_RDI->data)._M_elems[10] = *(uint *)&in_RSI[1].memFactor;
  (in_RDI->data)._M_elems[0xb] = *(uint *)((long)&in_RSI[1].memFactor + 4);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff90,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff90,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff90,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff90,in_RDI);
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (in_stack_ffffffffffffff90,in_RDI);
  *(byte *)(in_RDI[5].data._M_elems + 0xc) = *(byte *)&in_RSI[0x1c].memFactor & 1;
  *(byte *)((long)in_RDI[5].data._M_elems + 0x31) = *(byte *)((long)&in_RSI[0x1c].memFactor + 1) & 1
  ;
  DataArray<int>::DataArray(in_RSI,in_stack_ffffffffffffff98);
  return;
}

Assistant:

DuplicateColsPS(const DuplicateColsPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_loJ(old.m_loJ)
         , m_upJ(old.m_upJ)
         , m_loK(old.m_loK)
         , m_upK(old.m_upK)
         , m_scale(old.m_scale)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_perm(old.m_perm)
      {}